

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment.cpp
# Opt level: O0

uint64_t pstore::repo::fragment::
         section_offset_is_valid<(pstore::repo::section_kind)3,pstore::repo::generic_section>
                   (fragment *f,extent<pstore::repo::fragment> *fext,uint64_t min_offset,
                   uint64_t offset,size_t size)

{
  value_type vVar1;
  generic_section *this;
  size_t sVar2;
  size_t size_local;
  uint64_t offset_local;
  uint64_t min_offset_local;
  extent<pstore::repo::fragment> *fext_local;
  fragment *f_local;
  
  vVar1 = typed_address<pstore::repo::fragment>::absolute(&fext->addr);
  if (((((vVar1 + offset & 7) == 0) && (0xf < size)) && (min_offset <= offset)) &&
     ((size <= fext->size && (offset <= fext->size - size)))) {
    this = offset_to_instance<pstore::repo::generic_section>(f,offset);
    sVar2 = generic_section::size_bytes(this);
    if (sVar2 <= size) {
      return offset + size;
    }
  }
  return 0;
}

Assistant:

std::uint64_t
fragment::section_offset_is_valid (fragment const & f, pstore::extent<fragment> const & fext,
                                   std::uint64_t const min_offset, std::uint64_t const offset,
                                   std::size_t const size) {
    PSTORE_STATIC_ASSERT (alignof (fragment) >= alignof (InstanceType));
    return ((fext.addr.absolute () + offset) % alignof (InstanceType) != 0 ||
            size < sizeof (InstanceType) || offset < min_offset || size > fext.size ||
            offset > fext.size - size ||
            f.offset_to_instance<InstanceType> (offset).size_bytes () > size)
               ? 0
               : offset + size;
}